

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

bigint * __thiscall fmt::v10::detail::bigint::operator<<=(bigint *this,int shift)

{
  uint uVar1;
  uint *puVar2;
  size_t sVar3;
  sbyte sVar4;
  size_t sVar5;
  bigit carry;
  
  if (-1 < shift) {
    this->exp_ = this->exp_ + ((uint)shift >> 5);
    if ((shift & 0x1fU) != 0) {
      carry = 0;
      puVar2 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
      sVar3 = (this->bigits_).super_buffer<unsigned_int>.size_;
      sVar4 = (sbyte)(shift & 0x1fU);
      for (sVar5 = 0; sVar3 != sVar5; sVar5 = sVar5 + 1) {
        uVar1 = puVar2[sVar5];
        puVar2[sVar5] = (uVar1 << sVar4) + carry;
        carry = uVar1 >> (0x20U - sVar4 & 0x1f);
      }
      if (carry != 0) {
        buffer<unsigned_int>::push_back((buffer<unsigned_int> *)this,&carry);
      }
    }
    return this;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/fmtlib/repo/include/fmt/format.h"
              ,0xb4f,anon_var_dwarf_4657bc + 9);
}

Assistant:

auto operator<<=(int shift) -> bigint& {
    FMT_ASSERT(shift >= 0, "");
    exp_ += shift / bigit_bits;
    shift %= bigit_bits;
    if (shift == 0) return *this;
    bigit carry = 0;
    for (size_t i = 0, n = bigits_.size(); i < n; ++i) {
      bigit c = bigits_[i] >> (bigit_bits - shift);
      bigits_[i] = (bigits_[i] << shift) + carry;
      carry = c;
    }
    if (carry != 0) bigits_.push_back(carry);
    return *this;
  }